

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

Vec3<float> * __thiscall Imath_2_5::Vec3<float>::normalize(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar4 = 0;
  fVar3 = this->z * this->z + this->x * this->x + this->y * this->y;
  if (2.3509887e-38 <= fVar3) {
    fVar3 = SQRT(fVar3);
  }
  else {
    fVar3 = lengthTiny(this);
    uVar4 = extraout_XMM0_Db;
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    uVar1 = this->x;
    uVar2 = this->y;
    auVar5._4_4_ = uVar2;
    auVar5._0_4_ = uVar1;
    auVar5._8_8_ = 0;
    auVar6._4_4_ = fVar3;
    auVar6._0_4_ = fVar3;
    auVar6._8_4_ = uVar4;
    auVar6._12_4_ = uVar4;
    auVar6 = divps(auVar5,auVar6);
    this->x = (float)(int)auVar6._0_8_;
    this->y = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
    this->z = this->z / fVar3;
  }
  return this;
}

Assistant:

const Vec3<T> &
Vec3<T>::normalize ()
{
    T l = length();

    if (l != T (0))
    {
        //
        // Do not replace the divisions by l with multiplications by 1/l.
        // Computing 1/l can overflow but the divisions below will always
        // produce results less than or equal to 1.
        //

	x /= l;
	y /= l;
	z /= l;
    }

    return *this;
}